

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::AllocateLoopHeaders(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LoopHeader *pLVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  ulong count;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pLVar4 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                     ((FunctionProxy *)this);
  if (pLVar4 != (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ac2,"(this->GetLoopHeaderArray() == nullptr)",
                                "this->GetLoopHeaderArray() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetLoopCount(this);
  if (uVar3 != 0) {
    count = (ulong)uVar3;
    local_48 = (undefined1  [8])&LoopHeader::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1ac7;
    data.plusSize = count;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_48);
    pLVar4 = Memory::AllocateArray<Memory::Recycler,Js::LoopHeader,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocZero,0,count);
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
              ((FunctionProxy *)this,pLVar4);
    pLVar4 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                       ((FunctionProxy *)this);
    while (bVar2 = count != 0, count = count - 1, bVar2) {
      LoopHeader::Init(pLVar4,this);
      pLVar4 = pLVar4 + 1;
    }
  }
  return;
}

Assistant:

void FunctionBody::AllocateLoopHeaders()
    {
        Assert(this->GetLoopHeaderArray() == nullptr);

        uint loopCount = GetLoopCount();
        if (loopCount != 0)
        {
            this->SetLoopHeaderArray(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), LoopHeader, loopCount));
            auto loopHeaderArray = this->GetLoopHeaderArray();
            for (uint i = 0; i < loopCount; i++)
            {
                loopHeaderArray[i].Init(this);
            }
        }
    }